

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.cpp
# Opt level: O1

Utf8SourceInfo *
Js::Utf8SourceInfo::NewWithHolder
          (ScriptContext *scriptContext,ISourceHolder *sourceHolder,int32 length,SRCINFO *srcInfo,
          bool isLibraryCode,Var scriptSource)

{
  SourceContextInfo *pSVar1;
  Recycler *this;
  undefined8 uVar2;
  bool bVar3;
  char cVar4;
  byte bVar5;
  Recycler *alloc;
  Utf8SourceInfo *this_00;
  SRCINFO *srcInfo_00;
  uchar *puVar6;
  Type TVar7;
  DWORD_PTR secondaryHostSourceContext;
  undefined1 local_70 [8];
  TrackAllocData data;
  
  pSVar1 = (srcInfo->sourceContextInfo).ptr;
  data._32_8_ = sourceHolder;
  if ((pSVar1->dwHostSourceContext == 0xffffffffffffffff) ||
     (secondaryHostSourceContext = 0xffffffffffffffff, (pSVar1->isHostDynamicDocument & 1U) != 0)) {
    secondaryHostSourceContext =
         DebugManager::AllocateSecondaryHostSourceContext
                   (scriptContext->threadContext->debugManager);
  }
  this = scriptContext->recycler;
  local_70 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_3260db0;
  data.filename._0_4_ = 0xd0;
  alloc = Memory::Recycler::TrackAllocInfo(this,(TrackAllocData *)local_70);
  this_00 = (Utf8SourceInfo *)new<Memory::Recycler>(0xc0,alloc,0x3a2aea);
  srcInfo_00 = SRCINFO::Copy(this,srcInfo);
  uVar2 = data._32_8_;
  Utf8SourceInfo(this_00,(ISourceHolder *)data._32_8_,length,srcInfo_00,secondaryHostSourceContext,
                 scriptContext,isLibraryCode,scriptSource);
  if (!isLibraryCode) {
    bVar3 = ScriptContext::IsScriptContextInDebugMode(scriptContext);
    if (bVar3) {
      puVar6 = (uchar *)(**(code **)(*(long *)uVar2 + 0x30))(uVar2,L"Debug Mode Loading");
      Memory::Recycler::WBSetBit((char *)&this_00->debugModeSource);
      (this_00->debugModeSource).ptr = puVar6;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&this_00->debugModeSource);
      TVar7 = (**(code **)(*(long *)uVar2 + 0x38))(uVar2,L"Debug Mode Loading");
      this_00->debugModeSourceLength = TVar7;
      if ((this_00->debugModeSource).ptr == (uchar *)0x0) {
        bVar5 = 0x20;
      }
      else {
        cVar4 = (**(code **)(*(long *)uVar2 + 0x50))(uVar2);
        bVar5 = cVar4 << 5;
      }
      this_00->field_0xa8 = this_00->field_0xa8 & 0xdf | bVar5;
    }
  }
  return this_00;
}

Assistant:

Utf8SourceInfo*
    Utf8SourceInfo::NewWithHolder(ScriptContext* scriptContext, ISourceHolder* sourceHolder,
        int32 length, SRCINFO const* srcInfo, bool isLibraryCode, Js::Var scriptSource)
    {
        // TODO: make this finalizable? Or have a finalizable version which would HeapDelete the string? Is this needed?
        DWORD_PTR secondaryHostSourceContext = Js::Constants::NoHostSourceContext;
#ifdef ENABLE_SCRIPT_DEBUGGING
        if (srcInfo->sourceContextInfo->IsDynamic())
        {
            secondaryHostSourceContext = scriptContext->GetThreadContext()->GetDebugManager()->AllocateSecondaryHostSourceContext();
        }
#endif

        Recycler * recycler = scriptContext->GetRecycler();

        Utf8SourceInfo* toReturn = RecyclerNewFinalized(recycler,
            Utf8SourceInfo, sourceHolder, length, SRCINFO::Copy(recycler, srcInfo),
            secondaryHostSourceContext, scriptContext, isLibraryCode, scriptSource);

#ifdef ENABLE_SCRIPT_DEBUGGING
        if (!isLibraryCode && scriptContext->IsScriptContextInDebugMode())
        {
            toReturn->debugModeSource = sourceHolder->GetSource(_u("Debug Mode Loading"));
            toReturn->debugModeSourceLength = sourceHolder->GetByteLength(_u("Debug Mode Loading"));
            toReturn->debugModeSourceIsEmpty = toReturn->debugModeSource == nullptr || sourceHolder->IsEmpty();
        }
#endif

        return toReturn;
    }